

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::operator!=(Am_Value *this,int test_value)

{
  ushort uVar1;
  double dVar2;
  bool bVar3;
  
  uVar1 = this->type;
  if (uVar1 - 2 < 2) {
LAB_0022baa5:
    bVar3 = (this->value).wrapper_value != (Am_Wrapper *)(long)test_value;
  }
  else {
    if (uVar1 == 5) {
      bVar3 = (float)test_value != (this->value).float_value;
    }
    else {
      if (uVar1 != 0x8006) {
        if (uVar1 != 0x4000) {
          return true;
        }
        goto LAB_0022baa5;
      }
      dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value)
      ;
      bVar3 = (double)test_value != dVar2;
    }
    bVar3 = (bool)(-bVar3 & 1);
  }
  return bVar3;
}

Assistant:

bool
Am_Value::operator!=(int test_value) const
{
  switch (type) {
  case Am_INT:
  case Am_LONG:
  case Am_ENUM:
    return value.long_value != test_value;
  case Am_FLOAT:
    return value.float_value != test_value;
  case Am_DOUBLE:
    return (double)*(Am_Double_Data *)value.wrapper_value != test_value;
  default:
    return true;
  }
}